

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.cpp
# Opt level: O2

void __thiscall
HFactor::btranCall(HFactor *this,vector<double,_std::allocator<double>_> *vector,
                  HighsTimerClock *factor_timer_clock_pointer)

{
  vector<double,_std::allocator<double>_> *pvVar1;
  
  HVectorBase<double>::clearScalars(&this->rhs_);
  pvVar1 = &(this->rhs_).array;
  std::vector<double,_std::allocator<double>_>::_M_move_assign(pvVar1,vector);
  (this->rhs_).count = -1;
  btranCall(this,&this->rhs_,1.0,factor_timer_clock_pointer);
  std::vector<double,_std::allocator<double>_>::_M_move_assign(vector,pvVar1);
  return;
}

Assistant:

void HFactor::btranCall(std::vector<double>& vector,
                        HighsTimerClock* factor_timer_clock_pointer) {
  // Only have to clear the scalars of the local HVector, since the
  // array is moved in. Set the count to -1 to indicate that indices
  // aren't known.
  this->rhs_.clearScalars();
  this->rhs_.array = std::move(vector);
  this->rhs_.count = -1;
  const double expected_density = 1;
  btranCall(this->rhs_, expected_density, factor_timer_clock_pointer);
  vector = std::move(this->rhs_.array);
}